

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O2

int Fra_Clau(Aig_Man_t *pMan,int nIters,int fVerbose,int fVeryVerbose)

{
  sat_solver *s;
  int iVar1;
  Cla_Man_t *p;
  bool bVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  Vec_Int_t *vRemapped;
  
  if (pMan->nObjs[3] - pMan->nRegs != 1) {
    __assert_fail("Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                  ,0x281,"int Fra_Clau(Aig_Man_t *, int, int, int)");
  }
  p = Fra_ClauStart(pMan);
  if (p == (Cla_Man_t *)0x0) {
    puts("The property is trivially inductive.");
    return 1;
  }
  bVar2 = fVeryVerbose != 0 && fVerbose != 0;
  uVar7 = 0;
  do {
    pVVar4 = p->vCexMain0;
    iVar1 = Fra_ClauCheckProperty(p,pVVar4);
    if ((iVar1 != 0) || (nIters <= (int)uVar7)) goto LAB_004f5261;
    if (fVerbose != 0) {
      printf("%4d : ",(ulong)uVar7);
    }
    vRemapped = p->vCexMain;
    Fra_ClauRemapClause(p->pMapCsMainToCsTest,pVVar4,vRemapped,0);
    if (bVar2) {
      Fra_ClauPrintClause(p->vSatVarsTestCs,vRemapped);
    }
    pVVar4 = p->vCexTest;
    uVar3 = 0;
    while( true ) {
      iVar1 = Fra_ClauCheckClause(p,vRemapped,pVVar4);
      vRemapped = p->vCexMain;
      if (iVar1 != 0) break;
      pVVar4 = p->vCexTest;
      Fra_ClauReduceClause(vRemapped,pVVar4);
      Fra_ClauRemapClause(p->pMapCsTestToNsBmc,vRemapped,p->vCexBmc,0);
      if (vRemapped->nSize < 1) {
        pVVar4 = p->vCexMain0;
        Vec_IntComplement(pVVar4);
        iVar1 = sat_solver_addclause(p->pSatMain,pVVar4->pArray,pVVar4->pArray + pVVar4->nSize);
        if (iVar1 == 0) {
          pcVar6 = "\nProperty is proved after %d iterations.\n";
          uVar5 = (ulong)(uVar7 + 1);
          goto LAB_004f5272;
        }
        pcVar6 = " Reducing failed after %d iterations (BMC failed).\n";
        goto LAB_004f51b0;
      }
      uVar3 = uVar3 + 1;
    }
    if (vRemapped->nSize == 0) {
      pcVar6 = " Reducing failed after %d iterations (nothing left).\n";
LAB_004f51b0:
      if (fVerbose != 0) {
        printf(pcVar6,(ulong)uVar3);
      }
    }
    else {
      if (fVerbose != 0) {
        printf("  ");
        if (bVar2) {
          Fra_ClauPrintClause(p->vSatVarsTestCs,vRemapped);
        }
        printf(" LitsInd = %3d.  ",(ulong)(uint)vRemapped->nSize);
      }
      pVVar4 = p->vCexBase;
      pVVar4->nSize = 0;
      uVar3 = vRemapped->nSize;
      if (1 < (int)uVar3) {
        Fra_ClauMinimizeClause(p,pVVar4,vRemapped);
        vRemapped = p->vCexMain;
        uVar3 = vRemapped->nSize;
      }
      if ((int)uVar3 < 1) {
        __assert_fail("Vec_IntSize(p->vCexMain) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                      ,0x2c0,"int Fra_Clau(Aig_Man_t *, int, int, int)");
      }
      if (fVeryVerbose != 0 && fVerbose != 0) {
        Fra_ClauPrintClause(p->vSatVarsTestCs,vRemapped);
        uVar3 = vRemapped->nSize;
LAB_004f51c9:
        printf(" LitsRed = %3d.  ",(ulong)uVar3);
        putchar(10);
      }
      else if (fVerbose != 0) goto LAB_004f51c9;
      pVVar4 = p->vCexAssm;
      Fra_ClauRemapClause(p->pMapCsTestToCsMain,vRemapped,pVVar4,1);
      s = p->pSatMain;
      iVar1 = sat_solver_addclause(s,pVVar4->pArray,pVVar4->pArray + pVVar4->nSize);
      if (iVar1 == 0) {
        uVar7 = uVar7 + 1;
LAB_004f5261:
        if (uVar7 != nIters) {
          printf("Property is proved after %d iterations.\n",(ulong)uVar7);
          Fra_ClauStop(p);
          return 1;
        }
        pcVar6 = "Property is not proved after %d iterations.\n";
        uVar5 = (ulong)(uint)nIters;
LAB_004f5272:
        printf(pcVar6,uVar5);
        return 0;
      }
      if (s->qtail != s->qhead) {
        iVar1 = sat_solver_simplify(s);
        if (iVar1 == 0) {
          __assert_fail("RetValue != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                        ,0x2d2,"int Fra_Clau(Aig_Man_t *, int, int, int)");
        }
        if (s->qtail != s->qhead) {
          __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                        ,0x2d3,"int Fra_Clau(Aig_Man_t *, int, int, int)");
        }
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int Fra_Clau( Aig_Man_t * pMan, int nIters, int fVerbose, int fVeryVerbose )
{
    Cla_Man_t * p;
    int Iter, RetValue, fFailed, i;
    assert( Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) == 1 );
    // create the manager
    p = Fra_ClauStart( pMan );
    if ( p == NULL )
    {
        printf( "The property is trivially inductive.\n" );
        return 1;
    }
    // generate counter-examples and expand them
    for ( Iter = 0; !Fra_ClauCheckProperty( p, p->vCexMain0 ) && Iter < nIters; Iter++ )
    {
        if ( fVerbose )
            printf( "%4d : ", Iter );
        // remap clause into the test manager
        Fra_ClauRemapClause( p->pMapCsMainToCsTest, p->vCexMain0, p->vCexMain, 0 );
        if ( fVerbose && fVeryVerbose )
            Fra_ClauPrintClause( p->vSatVarsTestCs, p->vCexMain );
        // the main counter-example is in p->vCexMain
        // intermediate counter-examples are in p->vCexTest
        // generate the reduced counter-example to the inductive property
        fFailed = 0;
        for ( i = 0; !Fra_ClauCheckClause( p, p->vCexMain, p->vCexTest ); i++ )
        {
            Fra_ClauReduceClause( p->vCexMain, p->vCexTest );
            Fra_ClauRemapClause( p->pMapCsTestToNsBmc, p->vCexMain, p->vCexBmc, 0 );

//            if ( !Fra_ClauCheckBmc(p, p->vCexBmc) )
            if ( Vec_IntSize(p->vCexMain) < 1 )
            {
                Vec_IntComplement( p->vCexMain0 ); 
                RetValue = sat_solver_addclause( p->pSatMain, Vec_IntArray(p->vCexMain0), Vec_IntArray(p->vCexMain0) + Vec_IntSize(p->vCexMain0) );
                if ( RetValue == 0 )
                {
                    printf( "\nProperty is proved after %d iterations.\n", Iter+1 );
                    return 0;
                }
                fFailed = 1;
                break;
            }
        }
        if ( fFailed )
        {
            if ( fVerbose )
                printf( " Reducing failed after %d iterations (BMC failed).\n", i );
            continue;
        }
        if ( Vec_IntSize(p->vCexMain) == 0 )
        {
            if ( fVerbose )
                printf( " Reducing failed after %d iterations (nothing left).\n", i );
            continue;
        }
        if ( fVerbose )
            printf( "  " );
        if ( fVerbose && fVeryVerbose )
            Fra_ClauPrintClause( p->vSatVarsTestCs, p->vCexMain );
        if ( fVerbose )
            printf( " LitsInd = %3d.  ", Vec_IntSize(p->vCexMain) );
        // minimize the inductive property
        Vec_IntClear( p->vCexBase );
        if ( Vec_IntSize(p->vCexMain) > 1 )
//        Fra_ClauMinimizeClause_rec( p, p->vCexBase, p->vCexMain );
            Fra_ClauMinimizeClause( p, p->vCexBase, p->vCexMain );
        assert( Vec_IntSize(p->vCexMain) > 0 );
        if ( fVerbose && fVeryVerbose )
            Fra_ClauPrintClause( p->vSatVarsTestCs, p->vCexMain );
        if ( fVerbose )
            printf( " LitsRed = %3d.  ", Vec_IntSize(p->vCexMain) );
        if ( fVerbose )
            printf( "\n" );
        // add the clause to the solver
        Fra_ClauRemapClause( p->pMapCsTestToCsMain, p->vCexMain, p->vCexAssm, 1 );
        RetValue = sat_solver_addclause( p->pSatMain, Vec_IntArray(p->vCexAssm), Vec_IntArray(p->vCexAssm) + Vec_IntSize(p->vCexAssm) );
        if ( RetValue == 0 )
        {
            Iter++;
            break;
        }
        if ( p->pSatMain->qtail != p->pSatMain->qhead )
        {
            RetValue = sat_solver_simplify(p->pSatMain);
            assert( RetValue != 0 );
            assert( p->pSatMain->qtail == p->pSatMain->qhead );
        }
    }

    // report the results
    if ( Iter == nIters )
    {
        printf( "Property is not proved after %d iterations.\n", nIters );
        return 0;
    }
    printf( "Property is proved after %d iterations.\n", Iter );
    Fra_ClauStop( p );
    return 1;
}